

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsplit.hpp
# Opt level: O3

void __thiscall
ncursespp::
vsplit<ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
::resize_impl<0ul,1ul,2ul>
          (vsplit<ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
           *this,ulong param_2,ulong param_3)

{
  color_rect *this_00;
  text *this_01;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  point<int> pVar6;
  int iVar7;
  uint uVar8;
  rect_i r;
  rect_i r_00;
  
  uVar2 = (int)param_3 - (int)param_2;
  param_2 = param_2 & 0xffffffff00000000;
  param_3 = param_3 & 0xffffffff00000000;
  iVar5 = uVar2 - 0x14;
  if ((int)uVar2 < 0x15) {
    iVar5 = 0;
  }
  uVar3 = 0x14;
  if ((int)uVar2 < 0x14) {
    uVar3 = uVar2;
  }
  uVar4 = iVar5 - 1;
  uVar8 = 0;
  if (1 < iVar5) {
    uVar8 = uVar4;
  }
  iVar7 = 1;
  if (iVar5 < 1) {
    iVar7 = iVar5;
  }
  uVar1 = 0;
  if (uVar2 == 0xffffffff) {
    if (0 < (int)uVar8) {
      hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>
      ::resize_impl<0ul,1ul>
                (*(hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>
                   **)(this + 0x10),param_2,uVar8 | param_3);
      uVar8 = 0;
      goto LAB_00102adf;
    }
  }
  else if (0 < (int)uVar2) {
    hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>
    ::resize_impl<0ul,1ul>
              (*(hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>
                 **)(this + 0x10),param_2,uVar3 - 1 | param_3);
    uVar1 = uVar3;
  }
  uVar4 = uVar1;
  if (iVar5 == -1) {
    return;
  }
LAB_00102adf:
  uVar2 = uVar4;
  if (0 < iVar5) {
    uVar2 = uVar4 + iVar7;
    pVar6 = (point<int>)((uVar4 - 1) + iVar7 | param_3);
    this_00 = *(color_rect **)(this + 8);
    r.right_bottom = pVar6;
    r.left_top = (point<int>)(uVar4 | param_2);
    color_rect::redraw(this_00,r);
    (this_00->super_widget<ncursespp::color_rect>).size_.left_top = (point<int>)(uVar4 | param_2);
    (this_00->super_widget<ncursespp::color_rect>).size_.right_bottom = pVar6;
  }
  if (0 < (int)uVar8) {
    pVar6 = (point<int>)(param_3 | uVar8 + uVar2);
    this_01 = *(text **)this;
    r_00.right_bottom = pVar6;
    r_00.left_top = (point<int>)(param_2 | uVar2);
    text::do_resize(this_01,r_00);
    (this_01->super_widget<ncursespp::text>).size_.left_top = (point<int>)(param_2 | uVar2);
    (this_01->super_widget<ncursespp::text>).size_.right_bottom = pVar6;
  }
  return;
}

Assistant:

void resize_impl(rect_i size, std::index_sequence<I...>)
    {
        std::array<int, count> widths {};
        int idx = 0;
        auto space = size.width();

        // query size_calculator<>::calc for every constraint_t in Splits
        // calc will decrement space when the size is known
        auto apply_calc = [&](auto& S) {
            using SplitType = std::decay_t<decltype(S)>;
            widths[idx] = SplitType::calc(space);
            idx ++;
        };

        (apply_calc(std::get<I>(splits)), ...);

        idx = 0;
        int xpos = 0;
        auto apply_resize = [&](auto& S) {
            if (widths[idx] == -1 && space > 0) {
                auto r = rect_i{{xpos, size.left_top.y}, {xpos + space, size.right_bottom.y}};
                xpos += space;
                space = 0;
                S.resize(r);
            } else if (widths[idx] > 0) {
                auto r = rect_i{{xpos, size.left_top.y}, {xpos + widths[idx] - 1, size.right_bottom.y}};
                xpos += widths[idx];
                S.resize(r);
            }

            idx ++;
        };

        (apply_resize(std::get<I>(splits)), ...);
    }